

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::eval
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,numeric_type val)

{
  variable_index_out_of_bounds_exception *this_00;
  numeric_type val_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (this->id_ != 0) {
    this_00 = (variable_index_out_of_bounds_exception *)__cxa_allocate_exception(0x18);
    variable_index_out_of_bounds_exception::variable_index_out_of_bounds_exception
              (this_00,this->id_,1);
    __cxa_throw(this_00,&variable_index_out_of_bounds_exception::typeinfo,
                variable_index_out_of_bounds_exception::~variable_index_out_of_bounds_exception);
  }
  return val;
}

Assistant:

numeric_type eval(numeric_type val) const
      {
        if (id_ > 0)
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), 1);

        return val;
      }